

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

FrameIndex __thiscall iDynTree::Model::getFrameIndex(Model *this,string *frameName)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pcVar3;
  size_t sVar4;
  FrameIndex FVar5;
  int iVar6;
  ostream *poVar7;
  size_type *psVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  stringstream ss;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pLVar1 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar2 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar10 = ((long)pLVar1 - (long)pLVar2 >> 4) * 0x6db6db6db6db6db7;
  if (pLVar1 != pLVar2) {
    pcVar3 = (frameName->_M_dataplus)._M_p;
    sVar4 = frameName->_M_string_length;
    psVar8 = &((this->linkNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar11 = 0;
    do {
      if (sVar4 == *psVar8) {
        if (sVar4 == 0) {
          return lVar11;
        }
        iVar6 = bcmp(pcVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (psVar8 + -1))->_M_dataplus)._M_p,sVar4);
        if (iVar6 == 0) {
          return lVar11;
        }
      }
      lVar11 = lVar11 + 1;
      psVar8 = psVar8 + 4;
    } while (uVar10 + (uVar10 == 0) != lVar11);
  }
  lVar11 = ((long)(this->additionalFrames).
                  super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->additionalFrames).
                  super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  if (uVar10 < lVar11 + uVar10) {
    pcVar3 = (frameName->_M_dataplus)._M_p;
    sVar4 = frameName->_M_string_length;
    psVar8 = &((this->frameNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar9 = 0;
    do {
      if ((sVar4 == *psVar8) &&
         ((sVar4 == 0 ||
          (iVar6 = bcmp(pcVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(psVar8 + -1))->_M_dataplus)._M_p,sVar4), iVar6 == 0)))) {
        return uVar10 - lVar9;
      }
      lVar9 = lVar9 + -1;
      psVar8 = psVar8 + 4;
    } while (-lVar9 != lVar11);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Frame named ",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(frameName->_M_dataplus)._M_p,frameName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," not found in the model.",0x18);
  std::__cxx11::stringbuf::str();
  iDynTree::reportError("Model","getFrameIndex",(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  FVar5 = FRAME_INVALID_INDEX;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return FVar5;
}

Assistant:

FrameIndex Model::getFrameIndex(const std::string& frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return (FrameIndex)i;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return (FrameIndex)i;
        }
    }

    std::stringstream ss;
    ss << "Frame named " << frameName << " not found in the model.";
    reportError("Model","getFrameIndex",ss.str().c_str());
    return FRAME_INVALID_INDEX;
}